

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void * server_listen_(void)

{
  int __fd;
  int iVar1;
  undefined4 extraout_var;
  ssize_t sVar3;
  undefined4 extraout_var_00;
  Request *req;
  void *extraout_RAX;
  int addrlen;
  sockaddr address;
  char buffer [1000];
  socklen_t local_42c;
  sockaddr local_428;
  char local_418 [1000];
  void *pvVar2;
  
  __fd = master_fd;
  local_42c = 0x10;
  iVar1 = puts("\n* Server is listening on port 8000\n* Enter \'q\' to exit\n");
  pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  while (listening != 0) {
    iVar1 = accept(__fd,&local_428,&local_42c);
    if (iVar1 < 0) {
      perror("In accept");
    }
    memset(local_418,0,1000);
    sVar3 = read(iVar1,local_418,1000);
    if ((int)sVar3 + 1U < 2) {
      iVar1 = close(iVar1);
      pvVar2 = (void *)CONCAT44(extraout_var_00,iVar1);
    }
    else {
      iVar1 = append_to_requests(local_418,iVar1);
      req = (Request *)array_list_get(reqs,iVar1);
      process_request(req,reqs);
      pvVar2 = extraout_RAX;
    }
  }
  return pvVar2;
}

Assistant:

void *server_listen_() {
    int server_fd = master_fd;
    struct sockaddr address;
    int addrlen = sizeof(address);
    int new_socket;
    int valread;

    printf("\n* Server is listening on port 8000\n* Enter 'q' to exit\n\n");

    while (listening) {
        if ((new_socket = accept(server_fd, (struct sockaddr *) &address, (socklen_t *) &addrlen)) < 0) {
            perror("In accept");
        }

        char buffer[MAX_REQUEST_LENGTH] = {0};
        valread = read(new_socket, buffer, MAX_REQUEST_LENGTH);
        if (valread == 0 || valread == -1) {
            close(new_socket);
            continue;
        }
#ifdef TESTING
        printf("%s - new request\n", buffer);
#endif
        int last_req = append_to_requests(buffer, new_socket);
        process_request(array_list_get(reqs, last_req), reqs);
    }
}